

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdcpp.hpp
# Opt level: O2

unique_ptr<so_5::disp::active_group::impl::proxy_dispatcher_t,_std::default_delete<so_5::disp::active_group::impl::proxy_dispatcher_t>_>
 __thiscall
so_5::stdcpp::
make_unique<so_5::disp::active_group::impl::proxy_dispatcher_t,so_5::disp::active_group::disp_params_t>
          (stdcpp *this,disp_params_t *args)

{
  proxy_dispatcher_t *this_00;
  disp_params_t local_40;
  
  this_00 = (proxy_dispatcher_t *)operator_new(0x58);
  so_5::disp::active_group::disp_params_t::disp_params_t(&local_40,args);
  so_5::disp::active_group::impl::proxy_dispatcher_t::proxy_dispatcher_t(this_00,&local_40);
  *(proxy_dispatcher_t **)this = this_00;
  std::_Function_base::~_Function_base((_Function_base *)&local_40.m_queue_params);
  return (__uniq_ptr_data<so_5::disp::active_group::impl::proxy_dispatcher_t,_std::default_delete<so_5::disp::active_group::impl::proxy_dispatcher_t>,_true,_true>
          )(__uniq_ptr_data<so_5::disp::active_group::impl::proxy_dispatcher_t,_std::default_delete<so_5::disp::active_group::impl::proxy_dispatcher_t>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr< T >
make_unique( ARGS && ...args )
	{
		return std::unique_ptr< T >( new T( std::forward<ARGS>(args)... ) );
	}